

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O0

void __thiscall deqp::gles2::Functional::DeleteShaderCase::test(DeleteShaderCase *this)

{
  bool bVar1;
  GLboolean GVar2;
  GLenum err;
  deBool dVar3;
  TestError *pTVar4;
  DeleteShaderCase *this_local;
  
  (*(this->super_SimpleProgramCase).super_ApiCase.super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[6])();
  SimpleProgramCase::linkProgram(&this->super_SimpleProgramCase);
  err = glu::CallLogWrapper::glGetError
                  (&(this->super_SimpleProgramCase).super_ApiCase.super_CallLogWrapper);
  glu::checkError(err,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderApiTests.cpp"
                  ,0x1e4);
  deleteShaders(this);
  while (((dVar3 = ::deGetFalse(), dVar3 == 0 &&
          (bVar1 = checkDeleteStatus(this,(this->super_SimpleProgramCase).m_vertShader), bVar1)) &&
         (bVar1 = checkDeleteStatus(this,(this->super_SimpleProgramCase).m_fragShader), bVar1))) {
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      glu::CallLogWrapper::glDeleteProgram
                (&(this->super_SimpleProgramCase).super_ApiCase.super_CallLogWrapper,
                 (this->super_SimpleProgramCase).m_program);
      while (((dVar3 = ::deGetFalse(), dVar3 == 0 &&
              (GVar2 = glu::CallLogWrapper::glIsShader
                                 (&(this->super_SimpleProgramCase).super_ApiCase.
                                   super_CallLogWrapper,(this->super_SimpleProgramCase).m_vertShader
                                 ), GVar2 == '\0')) &&
             (GVar2 = glu::CallLogWrapper::glIsShader
                                (&(this->super_SimpleProgramCase).super_ApiCase.super_CallLogWrapper
                                 ,(this->super_SimpleProgramCase).m_fragShader), GVar2 == '\0'))) {
        dVar3 = ::deGetFalse();
        if (dVar3 == 0) {
          return;
        }
      }
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,(char *)0x0,"!(glIsShader(m_vertShader) || glIsShader(m_fragShader))",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderApiTests.cpp"
                 ,0x1ec);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar4,(char *)0x0,"checkDeleteStatus(m_vertShader) && checkDeleteStatus(m_fragShader)"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderApiTests.cpp"
             ,0x1e8);
  __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void test (void)
	{
		compileShaders();
		linkProgram();
		GLU_CHECK();

		deleteShaders();

		TCU_CHECK(checkDeleteStatus(m_vertShader) && checkDeleteStatus(m_fragShader));

		glDeleteProgram(m_program);

		TCU_CHECK(!(glIsShader(m_vertShader) || glIsShader(m_fragShader)));
	}